

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# downloader.h
# Opt level: O2

int __thiscall DownloadPackage::match(DownloadPackage *this,DownloadPackage *p)

{
  string *__lhs;
  ulong uVar1;
  bool bVar2;
  int iVar3;
  ulong uVar4;
  ulong uVar5;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ioptions;
  
  bVar2 = std::operator!=(&this->libname,&p->libname);
  iVar3 = 0x7fffffff;
  if (!bVar2) {
    __lhs = &this->version;
    bVar2 = std::operator!=(__lhs,"");
    if ((bVar2) && (bVar2 = std::operator!=(__lhs,&p->version), bVar2)) {
      return 0x7fffffff;
    }
    ioptions.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    ioptions.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    ioptions.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::
    __set_intersection<std::_Rb_tree_const_iterator<std::__cxx11::string>,std::_Rb_tree_const_iterator<std::__cxx11::string>,std::insert_iterator<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_less_iter>
              ((this->options)._M_t._M_impl.super__Rb_tree_header._M_header._M_left,
               &(this->options)._M_t._M_impl.super__Rb_tree_header,
               (p->options)._M_t._M_impl.super__Rb_tree_header._M_header._M_left,
               &(p->options)._M_t._M_impl.super__Rb_tree_header,&ioptions,0);
    bVar2 = std::operator==(__lhs,"");
    uVar4 = (p->options)._M_t._M_impl.super__Rb_tree_header._M_node_count;
    iVar3 = -1;
    if (!bVar2 || uVar4 != 0) {
      uVar1 = (this->options)._M_t._M_impl.super__Rb_tree_header._M_node_count;
      if (uVar4 < uVar1) {
        uVar4 = uVar1;
      }
      uVar5 = (long)ioptions.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)ioptions.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 5;
      if (uVar4 != uVar5) {
        iVar3 = (int)uVar1 - (int)uVar5;
      }
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&ioptions);
  }
  return iVar3;
}

Assistant:

int match(DownloadPackage& p){ //->lower is better
        if(libname!=p.libname)
            return INT_MAX;
        if(version!="" && version!=p.version)
            return INT_MAX;
        std::vector<std::string> ioptions;
        std::set_intersection(options.begin(),options.end(),p.options.begin(),p.options.end(),std::inserter(ioptions,ioptions.begin()));
        if((version=="" && p.options.size()==0) || std::max(options.size(),p.options.size())==ioptions.size()){
            return -1;  //means exactly same
        }
        return options.size()-ioptions.size();
    }